

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcessPrivate::start(QProcessPrivate *this,OpenMode mode)

{
  bool bVar1;
  OpenMode OVar2;
  QFlags<QIODeviceBase::OpenModeFlag> QVar3;
  QProcess *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __oflag;
  uint in_ESI;
  QProcessPrivate *in_RDI;
  long in_FS_OFFSET;
  QProcess *q;
  undefined4 in_stack_ffffffffffffff18;
  OpenModeFlag in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  enum_type in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar5;
  QProcess *pQVar4;
  QIODevice *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int count;
  QIODevicePrivate *in_stack_ffffffffffffff40;
  QProcessPrivate *this_01;
  QIODevice local_58 [2];
  undefined1 local_38 [32];
  uint local_18;
  CompareAgainstLiteralZero local_11;
  uint local_10;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_c;
  long local_8;
  
  count = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  QVar5.i = (Int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  local_c.i = in_ESI;
  this_00 = q_func(in_RDI);
  if ((in_RDI->stdinChannel).type != Normal) {
    OVar2 = ::operator~(in_stack_ffffffffffffff24);
    QFlags<QIODeviceBase::OpenModeFlag>::operator&=
              ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_c,
               (QFlags<QIODeviceBase::OpenModeFlag>)
               OVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  }
  if (((in_RDI->stdoutChannel).type != Normal) &&
     (((in_RDI->stderrChannel).type != Normal || (in_RDI->processChannelMode == '\x01')))) {
    OVar2 = ::operator~(in_stack_ffffffffffffff24);
    QFlags<QIODeviceBase::OpenModeFlag>::operator&=
              ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_c,
               (QFlags<QIODeviceBase::OpenModeFlag>)
               OVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  }
  local_10 = local_c.i;
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_11,0);
  bVar1 = ::operator==(local_10);
  if (bVar1) {
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    local_c.i = local_18;
  }
  QVar3 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero
            ((CompareAgainstLiteralZero *)(local_38 + 0x1f),0);
  bVar1 = ::operator==(QVar3.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  __oflag = extraout_EDX;
  if (bVar1) {
    if ((in_RDI->stdoutChannel).type == Normal) {
      in_stack_ffffffffffffff40 = (QIODevicePrivate *)local_38;
      pQVar4 = this_00;
      QProcess::nullDevice();
      count = (int)((ulong)pQVar4 >> 0x20);
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      QProcess::setStandardOutputFile
                ((QProcess *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (OpenMode)QVar5.i);
      QString::~QString((QString *)0x791fb5);
      __oflag = extraout_EDX_00;
    }
    if (((in_RDI->stderrChannel).type == Normal) && (in_RDI->processChannelMode != '\x01')) {
      in_stack_ffffffffffffff30 = local_58;
      pQVar4 = this_00;
      QProcess::nullDevice();
      QVar5.i = (Int)((ulong)pQVar4 >> 0x20);
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      QProcess::setStandardErrorFile
                ((QProcess *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (OpenMode)QVar5.i);
      QString::~QString((QString *)0x792054);
      __oflag = extraout_EDX_01;
    }
  }
  QIODevice::open(&this_00->super_QIODevice,(char *)(ulong)local_c.i,__oflag);
  bVar1 = QIODevice::isReadable(in_stack_ffffffffffffff30);
  if ((bVar1) && (in_RDI->processChannelMode != '\x01')) {
    QIODevicePrivate::setReadChannelCount(in_stack_ffffffffffffff40,count);
  }
  (in_RDI->stdinChannel).closed = false;
  (in_RDI->stdoutChannel).closed = false;
  (in_RDI->stderrChannel).closed = false;
  in_RDI->exitCode = 0;
  in_RDI->exitStatus = '\0';
  in_RDI->processError = '\x05';
  QString::clear((QString *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  startProcess(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProcessPrivate::start(QIODevice::OpenMode mode)
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug() << "QProcess::start(" << program << ',' << arguments << ',' << mode << ')';
#endif

    if (stdinChannel.type != QProcessPrivate::Channel::Normal)
        mode &= ~QIODevice::WriteOnly;     // not open for writing
    if (stdoutChannel.type != QProcessPrivate::Channel::Normal &&
        (stderrChannel.type != QProcessPrivate::Channel::Normal ||
         processChannelMode == QProcess::MergedChannels))
        mode &= ~QIODevice::ReadOnly;      // not open for reading
    if (mode == 0)
        mode = QIODevice::Unbuffered;
    if ((mode & QIODevice::ReadOnly) == 0) {
        if (stdoutChannel.type == QProcessPrivate::Channel::Normal)
            q->setStandardOutputFile(q->nullDevice());
        if (stderrChannel.type == QProcessPrivate::Channel::Normal
            && processChannelMode != QProcess::MergedChannels)
            q->setStandardErrorFile(q->nullDevice());
    }

    q->QIODevice::open(mode);

    if (q->isReadable() && processChannelMode != QProcess::MergedChannels)
        setReadChannelCount(2);

    stdinChannel.closed = false;
    stdoutChannel.closed = false;
    stderrChannel.closed = false;

    exitCode = 0;
    exitStatus = QProcess::NormalExit;
    processError = QProcess::UnknownError;
    errorString.clear();
    startProcess();
}